

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash.cc
# Opt level: O2

void * OPENSSL_lh_retrieve_key
                 (_LHASH *lh,void *key,uint32_t key_hash,_func_int_void_ptr_void_ptr *cmp_key)

{
  LHASH_ITEM *pLVar1;
  lhash_item_st *plVar2;
  lhash_item_st **pplVar3;
  int iVar4;
  void *pvVar5;
  lhash_item_st **pplVar6;
  
  pplVar3 = lh->buckets + (ulong)key_hash % lh->num_buckets;
  do {
    pplVar6 = pplVar3;
    pLVar1 = *pplVar6;
    if (pLVar1 == (LHASH_ITEM *)0x0) {
      return (void *)0x0;
    }
    iVar4 = (*cmp_key)(key,pLVar1->data);
    pplVar3 = &pLVar1->next;
  } while (iVar4 != 0);
  plVar2 = *pplVar6;
  if (plVar2 == (lhash_item_st *)0x0) {
    pvVar5 = (void *)0x0;
  }
  else {
    pvVar5 = plVar2->data;
  }
  return pvVar5;
}

Assistant:

void *OPENSSL_lh_retrieve_key(const _LHASH *lh, const void *key,
                              uint32_t key_hash,
                              int (*cmp_key)(const void *key,
                                             const void *value)) {
  LHASH_ITEM **next_ptr = get_next_ptr_by_key(lh, key, key_hash, cmp_key);
  return *next_ptr == NULL ? NULL : (*next_ptr)->data;
}